

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O1

randomx_vm * randomx_create_vm(randomx_flags flags,randomx_cache *cache,randomx_dataset *dataset)

{
  undefined *puVar1;
  randomx_vm *this;
  
  switch(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|
                 RANDOMX_FLAG_LARGE_PAGES)) {
  case RANDOMX_FLAG_DEFAULT:
    this = (randomx_vm *)
           randomx::InterpretedLightVm<randomx::AlignedAllocator<64ul>,true>::operator_new
                     ((InterpretedLightVm<randomx::AlignedAllocator<64ul>,true> *)0x2ac0,
                      (size_t)cache);
    memset(this,0,0x2ac0);
    (this->mem).memory = (uint8_t *)0x0;
    this->scratchpad = (uint8_t *)0x0;
    (this->field_6).cachePtr = (randomx_cache *)0x0;
    (this->cacheKey)._M_dataplus._M_p = (pointer)&(this->cacheKey).field_2;
    (this->cacheKey)._M_string_length = 0;
    (this->cacheKey).field_2._M_local_buf[0] = '\0';
    puVar1 = &randomx::InterpretedLightVm<randomx::AlignedAllocator<64ul>,true>::vtable;
    break;
  case RANDOMX_FLAG_LARGE_PAGES:
    this = (randomx_vm *)
           randomx::InterpretedLightVm<randomx::LargePageAllocator,true>::operator_new
                     ((InterpretedLightVm<randomx::LargePageAllocator,true> *)0x2ac0,(size_t)cache);
    memset(this,0,0x2ac0);
    (this->mem).memory = (uint8_t *)0x0;
    this->scratchpad = (uint8_t *)0x0;
    (this->field_6).cachePtr = (randomx_cache *)0x0;
    (this->cacheKey)._M_dataplus._M_p = (pointer)&(this->cacheKey).field_2;
    (this->cacheKey)._M_string_length = 0;
    (this->cacheKey).field_2._M_local_buf[0] = '\0';
    puVar1 = &randomx::InterpretedLightVm<randomx::LargePageAllocator,true>::vtable;
    break;
  case RANDOMX_FLAG_HARD_AES:
    this = (randomx_vm *)
           randomx::InterpretedLightVm<randomx::AlignedAllocator<64ul>,false>::operator_new
                     ((InterpretedLightVm<randomx::AlignedAllocator<64ul>,false> *)0x2ac0,
                      (size_t)cache);
    memset(this,0,0x2ac0);
    (this->mem).memory = (uint8_t *)0x0;
    this->scratchpad = (uint8_t *)0x0;
    (this->field_6).cachePtr = (randomx_cache *)0x0;
    (this->cacheKey)._M_dataplus._M_p = (pointer)&(this->cacheKey).field_2;
    (this->cacheKey)._M_string_length = 0;
    (this->cacheKey).field_2._M_local_buf[0] = '\0';
    puVar1 = &randomx::InterpretedLightVm<randomx::AlignedAllocator<64ul>,false>::vtable;
    break;
  case RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    this = (randomx_vm *)
           randomx::InterpretedLightVm<randomx::LargePageAllocator,false>::operator_new
                     ((InterpretedLightVm<randomx::LargePageAllocator,false> *)0x2ac0,(size_t)cache)
    ;
    memset(this,0,0x2ac0);
    (this->mem).memory = (uint8_t *)0x0;
    this->scratchpad = (uint8_t *)0x0;
    (this->field_6).cachePtr = (randomx_cache *)0x0;
    (this->cacheKey)._M_dataplus._M_p = (pointer)&(this->cacheKey).field_2;
    (this->cacheKey)._M_string_length = 0;
    (this->cacheKey).field_2._M_local_buf[0] = '\0';
    puVar1 = &randomx::InterpretedLightVm<randomx::LargePageAllocator,false>::vtable;
    break;
  case RANDOMX_FLAG_FULL_MEM:
    this = (randomx_vm *)
           randomx::InterpretedVm<randomx::AlignedAllocator<64ul>,true>::operator_new
                     ((InterpretedVm<randomx::AlignedAllocator<64ul>,true> *)0x2ac0,(size_t)cache);
    memset(this,0,0x2ac0);
    (this->mem).memory = (uint8_t *)0x0;
    this->scratchpad = (uint8_t *)0x0;
    (this->field_6).cachePtr = (randomx_cache *)0x0;
    (this->cacheKey)._M_dataplus._M_p = (pointer)&(this->cacheKey).field_2;
    (this->cacheKey)._M_string_length = 0;
    (this->cacheKey).field_2._M_local_buf[0] = '\0';
    puVar1 = &randomx::InterpretedVm<randomx::AlignedAllocator<64ul>,true>::vtable;
    break;
  case RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
    this = (randomx_vm *)
           randomx::InterpretedVm<randomx::LargePageAllocator,true>::operator_new
                     ((InterpretedVm<randomx::LargePageAllocator,true> *)0x2ac0,(size_t)cache);
    memset(this,0,0x2ac0);
    (this->mem).memory = (uint8_t *)0x0;
    this->scratchpad = (uint8_t *)0x0;
    (this->field_6).cachePtr = (randomx_cache *)0x0;
    (this->cacheKey)._M_dataplus._M_p = (pointer)&(this->cacheKey).field_2;
    (this->cacheKey)._M_string_length = 0;
    (this->cacheKey).field_2._M_local_buf[0] = '\0';
    puVar1 = &randomx::InterpretedVm<randomx::LargePageAllocator,true>::vtable;
    break;
  case RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
    this = (randomx_vm *)
           randomx::InterpretedVm<randomx::AlignedAllocator<64ul>,false>::operator_new
                     ((InterpretedVm<randomx::AlignedAllocator<64ul>,false> *)0x2ac0,(size_t)cache);
    memset(this,0,0x2ac0);
    (this->mem).memory = (uint8_t *)0x0;
    this->scratchpad = (uint8_t *)0x0;
    (this->field_6).cachePtr = (randomx_cache *)0x0;
    (this->cacheKey)._M_dataplus._M_p = (pointer)&(this->cacheKey).field_2;
    (this->cacheKey)._M_string_length = 0;
    (this->cacheKey).field_2._M_local_buf[0] = '\0';
    puVar1 = &randomx::InterpretedVm<randomx::AlignedAllocator<64ul>,false>::vtable;
    break;
  case RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    this = (randomx_vm *)
           randomx::InterpretedVm<randomx::LargePageAllocator,false>::operator_new
                     ((InterpretedVm<randomx::LargePageAllocator,false> *)0x2ac0,(size_t)cache);
    memset(this,0,0x2ac0);
    (this->mem).memory = (uint8_t *)0x0;
    this->scratchpad = (uint8_t *)0x0;
    (this->field_6).cachePtr = (randomx_cache *)0x0;
    (this->cacheKey)._M_dataplus._M_p = (pointer)&(this->cacheKey).field_2;
    (this->cacheKey)._M_string_length = 0;
    (this->cacheKey).field_2._M_local_buf[0] = '\0';
    puVar1 = &randomx::InterpretedVm<randomx::LargePageAllocator,false>::vtable;
    break;
  case RANDOMX_FLAG_JIT:
    if ((flags & RANDOMX_FLAG_SECURE) == RANDOMX_FLAG_DEFAULT) {
      this = (randomx_vm *)
             randomx::CompiledLightVm<randomx::AlignedAllocator<64ul>,true,false>::operator_new
                       ((CompiledLightVm<randomx::AlignedAllocator<64ul>,true,false> *)0xac0,
                        (size_t)cache);
      memset(this,0,0xac0);
      randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_true,_false>::CompiledVm
                ((CompiledVm<randomx::AlignedAllocator<64UL>,_true,_false> *)this);
      puVar1 = &randomx::CompiledLightVm<randomx::AlignedAllocator<64ul>,true,false>::vtable;
    }
    else {
      this = (randomx_vm *)
             randomx::CompiledLightVm<randomx::AlignedAllocator<64ul>,true,true>::operator_new
                       ((CompiledLightVm<randomx::AlignedAllocator<64ul>,true,true> *)0xac0,
                        (size_t)cache);
      memset(this,0,0xac0);
      randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_true,_true>::CompiledVm
                ((CompiledVm<randomx::AlignedAllocator<64UL>,_true,_true> *)this);
      puVar1 = &randomx::CompiledLightVm<randomx::AlignedAllocator<64ul>,true,true>::vtable;
    }
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES:
    if ((flags & RANDOMX_FLAG_SECURE) == RANDOMX_FLAG_DEFAULT) {
      this = (randomx_vm *)
             randomx::CompiledLightVm<randomx::LargePageAllocator,true,false>::operator_new
                       ((CompiledLightVm<randomx::LargePageAllocator,true,false> *)0xac0,
                        (size_t)cache);
      memset(this,0,0xac0);
      randomx::CompiledVm<randomx::LargePageAllocator,_true,_false>::CompiledVm
                ((CompiledVm<randomx::LargePageAllocator,_true,_false> *)this);
      puVar1 = &randomx::CompiledLightVm<randomx::LargePageAllocator,true,false>::vtable;
    }
    else {
      this = (randomx_vm *)
             randomx::CompiledLightVm<randomx::LargePageAllocator,true,true>::operator_new
                       ((CompiledLightVm<randomx::LargePageAllocator,true,true> *)0xac0,
                        (size_t)cache);
      memset(this,0,0xac0);
      randomx::CompiledVm<randomx::LargePageAllocator,_true,_true>::CompiledVm
                ((CompiledVm<randomx::LargePageAllocator,_true,_true> *)this);
      puVar1 = &randomx::CompiledLightVm<randomx::LargePageAllocator,true,true>::vtable;
    }
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES:
    if ((flags & RANDOMX_FLAG_SECURE) == RANDOMX_FLAG_DEFAULT) {
      this = (randomx_vm *)
             randomx::CompiledLightVm<randomx::AlignedAllocator<64ul>,false,false>::operator_new
                       ((CompiledLightVm<randomx::AlignedAllocator<64ul>,false,false> *)0xac0,
                        (size_t)cache);
      memset(this,0,0xac0);
      randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false>::CompiledVm
                ((CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false> *)this);
      puVar1 = &randomx::CompiledLightVm<randomx::AlignedAllocator<64ul>,false,false>::vtable;
    }
    else {
      this = (randomx_vm *)
             randomx::CompiledLightVm<randomx::AlignedAllocator<64ul>,false,true>::operator_new
                       ((CompiledLightVm<randomx::AlignedAllocator<64ul>,false,true> *)0xac0,
                        (size_t)cache);
      memset(this,0,0xac0);
      randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_false,_true>::CompiledVm
                ((CompiledVm<randomx::AlignedAllocator<64UL>,_false,_true> *)this);
      puVar1 = &randomx::CompiledLightVm<randomx::AlignedAllocator<64ul>,false,true>::vtable;
    }
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    if ((flags & RANDOMX_FLAG_SECURE) == RANDOMX_FLAG_DEFAULT) {
      this = (randomx_vm *)
             randomx::CompiledLightVm<randomx::LargePageAllocator,false,false>::operator_new
                       ((CompiledLightVm<randomx::LargePageAllocator,false,false> *)0xac0,
                        (size_t)cache);
      memset(this,0,0xac0);
      randomx::CompiledVm<randomx::LargePageAllocator,_false,_false>::CompiledVm
                ((CompiledVm<randomx::LargePageAllocator,_false,_false> *)this);
      puVar1 = &randomx::CompiledLightVm<randomx::LargePageAllocator,false,false>::vtable;
    }
    else {
      this = (randomx_vm *)
             randomx::CompiledLightVm<randomx::LargePageAllocator,false,true>::operator_new
                       ((CompiledLightVm<randomx::LargePageAllocator,false,true> *)0xac0,
                        (size_t)cache);
      memset(this,0,0xac0);
      randomx::CompiledVm<randomx::LargePageAllocator,_false,_true>::CompiledVm
                ((CompiledVm<randomx::LargePageAllocator,_false,_true> *)this);
      puVar1 = &randomx::CompiledLightVm<randomx::LargePageAllocator,false,true>::vtable;
    }
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM:
    if ((flags & RANDOMX_FLAG_SECURE) == RANDOMX_FLAG_DEFAULT) {
      this = (randomx_vm *)
             randomx::CompiledVm<randomx::AlignedAllocator<64ul>,true,false>::operator_new
                       ((CompiledVm<randomx::AlignedAllocator<64ul>,true,false> *)0xac0,
                        (size_t)cache);
      randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_true,_false>::CompiledVm
                ((CompiledVm<randomx::AlignedAllocator<64UL>,_true,_false> *)this);
    }
    else {
      this = (randomx_vm *)
             randomx::CompiledVm<randomx::AlignedAllocator<64ul>,true,true>::operator_new
                       ((CompiledVm<randomx::AlignedAllocator<64ul>,true,true> *)0xac0,(size_t)cache
                       );
      randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_true,_true>::CompiledVm
                ((CompiledVm<randomx::AlignedAllocator<64UL>,_true,_true> *)this);
    }
    goto LAB_00119eae;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
    if ((flags & RANDOMX_FLAG_SECURE) == RANDOMX_FLAG_DEFAULT) {
      this = (randomx_vm *)
             randomx::CompiledVm<randomx::LargePageAllocator,true,false>::operator_new
                       ((CompiledVm<randomx::LargePageAllocator,true,false> *)0xac0,(size_t)cache);
      randomx::CompiledVm<randomx::LargePageAllocator,_true,_false>::CompiledVm
                ((CompiledVm<randomx::LargePageAllocator,_true,_false> *)this);
    }
    else {
      this = (randomx_vm *)
             randomx::CompiledVm<randomx::LargePageAllocator,true,true>::operator_new
                       ((CompiledVm<randomx::LargePageAllocator,true,true> *)0xac0,(size_t)cache);
      randomx::CompiledVm<randomx::LargePageAllocator,_true,_true>::CompiledVm
                ((CompiledVm<randomx::LargePageAllocator,_true,_true> *)this);
    }
    goto LAB_00119eae;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
    if ((flags & RANDOMX_FLAG_SECURE) == RANDOMX_FLAG_DEFAULT) {
      this = (randomx_vm *)
             randomx::CompiledVm<randomx::AlignedAllocator<64ul>,false,false>::operator_new
                       ((CompiledVm<randomx::AlignedAllocator<64ul>,false,false> *)0xac0,
                        (size_t)cache);
      randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false>::CompiledVm
                ((CompiledVm<randomx::AlignedAllocator<64UL>,_false,_false> *)this);
    }
    else {
      this = (randomx_vm *)
             randomx::CompiledVm<randomx::AlignedAllocator<64ul>,false,true>::operator_new
                       ((CompiledVm<randomx::AlignedAllocator<64ul>,false,true> *)0xac0,
                        (size_t)cache);
      randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_false,_true>::CompiledVm
                ((CompiledVm<randomx::AlignedAllocator<64UL>,_false,_true> *)this);
    }
    goto LAB_00119eae;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    if ((flags & RANDOMX_FLAG_SECURE) == RANDOMX_FLAG_DEFAULT) {
      this = (randomx_vm *)
             randomx::CompiledVm<randomx::LargePageAllocator,false,false>::operator_new
                       ((CompiledVm<randomx::LargePageAllocator,false,false> *)0xac0,(size_t)cache);
      randomx::CompiledVm<randomx::LargePageAllocator,_false,_false>::CompiledVm
                ((CompiledVm<randomx::LargePageAllocator,_false,_false> *)this);
    }
    else {
      this = (randomx_vm *)
             randomx::CompiledVm<randomx::LargePageAllocator,false,true>::operator_new
                       ((CompiledVm<randomx::LargePageAllocator,false,true> *)0xac0,(size_t)cache);
      randomx::CompiledVm<randomx::LargePageAllocator,_false,_true>::CompiledVm
                ((CompiledVm<randomx::LargePageAllocator,_false,_true> *)this);
    }
    goto LAB_00119eae;
  }
  this->_vptr_randomx_vm = (_func_int **)(puVar1 + 0x10);
LAB_00119eae:
  if (cache != (randomx_cache *)0x0) {
    (*this->_vptr_randomx_vm[6])(this,cache);
    std::__cxx11::string::_M_assign((string *)&this->cacheKey);
  }
  if (dataset != (randomx_dataset *)0x0) {
    (*this->_vptr_randomx_vm[5])(this,dataset);
  }
  (*this->_vptr_randomx_vm[2])(this);
  return this;
}

Assistant:

randomx_vm *randomx_create_vm(randomx_flags flags, randomx_cache *cache, randomx_dataset *dataset) {
		assert(cache != nullptr || (flags & RANDOMX_FLAG_FULL_MEM));
		assert(cache == nullptr || cache->isInitialized());
		assert(dataset != nullptr || !(flags & RANDOMX_FLAG_FULL_MEM));

		randomx_vm *vm = nullptr;

		try {
			switch ((int)(flags & (RANDOMX_FLAG_FULL_MEM | RANDOMX_FLAG_JIT | RANDOMX_FLAG_HARD_AES | RANDOMX_FLAG_LARGE_PAGES))) {
				case RANDOMX_FLAG_DEFAULT:
					vm = new randomx::InterpretedLightVmDefault();
					break;

				case RANDOMX_FLAG_FULL_MEM:
					vm = new randomx::InterpretedVmDefault();
					break;

				case RANDOMX_FLAG_JIT:
					if (flags & RANDOMX_FLAG_SECURE) {
						vm = new randomx::CompiledLightVmDefaultSecure();
					}
					else {
						vm = new randomx::CompiledLightVmDefault();
					}
					break;

				case RANDOMX_FLAG_FULL_MEM | RANDOMX_FLAG_JIT:
					if (flags & RANDOMX_FLAG_SECURE) {
						vm = new randomx::CompiledVmDefaultSecure();
					}
					else {
						vm = new randomx::CompiledVmDefault();
					}
					break;

				case RANDOMX_FLAG_HARD_AES:
					vm = new randomx::InterpretedLightVmHardAes();
					break;

				case RANDOMX_FLAG_FULL_MEM | RANDOMX_FLAG_HARD_AES:
					vm = new randomx::InterpretedVmHardAes();
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_HARD_AES:
					if (flags & RANDOMX_FLAG_SECURE) {
						vm = new randomx::CompiledLightVmHardAesSecure();
					}
					else {
						vm = new randomx::CompiledLightVmHardAes();
					}
					break;

				case RANDOMX_FLAG_FULL_MEM | RANDOMX_FLAG_JIT | RANDOMX_FLAG_HARD_AES:
					if (flags & RANDOMX_FLAG_SECURE) {
						vm = new randomx::CompiledVmHardAesSecure();
					}
					else {
						vm = new randomx::CompiledVmHardAes();
					}
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					vm = new randomx::InterpretedLightVmLargePage();
					break;

				case RANDOMX_FLAG_FULL_MEM | RANDOMX_FLAG_LARGE_PAGES:
					vm = new randomx::InterpretedVmLargePage();
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					if (flags & RANDOMX_FLAG_SECURE) {
						vm = new randomx::CompiledLightVmLargePageSecure();
					}
					else {
						vm = new randomx::CompiledLightVmLargePage();
					}
					break;

				case RANDOMX_FLAG_FULL_MEM | RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					if (flags & RANDOMX_FLAG_SECURE) {
						vm = new randomx::CompiledVmLargePageSecure();
					}
					else {
						vm = new randomx::CompiledVmLargePage();
					}
					break;

				case RANDOMX_FLAG_HARD_AES | RANDOMX_FLAG_LARGE_PAGES:
					vm = new randomx::InterpretedLightVmLargePageHardAes();
					break;

				case RANDOMX_FLAG_FULL_MEM | RANDOMX_FLAG_HARD_AES | RANDOMX_FLAG_LARGE_PAGES:
					vm = new randomx::InterpretedVmLargePageHardAes();
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_HARD_AES | RANDOMX_FLAG_LARGE_PAGES:
					if (flags & RANDOMX_FLAG_SECURE) {
						vm = new randomx::CompiledLightVmLargePageHardAesSecure();
					}
					else {
						vm = new randomx::CompiledLightVmLargePageHardAes();
					}
					break;

				case RANDOMX_FLAG_FULL_MEM | RANDOMX_FLAG_JIT | RANDOMX_FLAG_HARD_AES | RANDOMX_FLAG_LARGE_PAGES:
					if (flags & RANDOMX_FLAG_SECURE) {
						vm = new randomx::CompiledVmLargePageHardAesSecure();
					}
					else {
						vm = new randomx::CompiledVmLargePageHardAes();
					}
					break;

				default:
					UNREACHABLE;
			}

			if(cache != nullptr) {
				vm->setCache(cache);
				vm->cacheKey = cache->cacheKey;
			}

			if(dataset != nullptr)
				vm->setDataset(dataset);

			vm->allocate();
		}
		catch (std::exception &ex) {
			delete vm;
			vm = nullptr;
		}

		return vm;
	}